

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxOut.cpp
# Opt level: O0

void __thiscall
OpenMD::FluxOut::FluxOut(FluxOut *this,SimInfo *info,string *filename,string *sele1,int axis)

{
  undefined8 *in_RDI;
  undefined4 in_R8D;
  string *in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  SimInfo *in_stack_00000048;
  SequentialAnalyzer *in_stack_00000050;
  string *in_stack_ffffffffffffff68;
  SequentialAnalyzer *this_00;
  string *str;
  string local_68 [32];
  string local_48 [36];
  undefined4 local_24;
  
  local_24 = in_R8D;
  SequentialAnalyzer::SequentialAnalyzer
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
             in_stack_00000030);
  *in_RDI = &PTR__FluxOut_00394b78;
  this_00 = (SequentialAnalyzer *)(in_RDI + 0x1a9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x136443);
  str = (string *)(in_RDI + 0x1ac);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x136459);
  *(undefined4 *)(in_RDI + 0x1af) = local_24;
  getPrefix(str);
  std::operator+(str,(char *)this_00);
  SequentialAnalyzer::setOutputName(this_00,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

FluxOut::FluxOut(SimInfo* info, const std::string& filename,
		   const std::string& sele1, int axis) :
    SequentialAnalyzer(info, filename, sele1, sele1), axis_(axis) {
    setOutputName(getPrefix(filename) + ".fluxOut");
  }